

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::CastToFloat(VirtualMachine *this)

{
  element_type *peVar1;
  double val;
  anon_union_8_6_52c89740_for_Variable_1 __str;
  Variable VVar2;
  string local_38;
  allocator<char> local_11;
  
  VVar2 = popOpStack(this);
  __str = VVar2.field_1;
  switch(VVar2.type) {
  case Undefined:
  case Boolean:
  case Object:
  case Function:
    pushUndefined(this);
    goto LAB_00117708;
  case Integer:
    __str.doubleValue = (double)__str.integerValue;
    break;
  case Float:
    break;
  case String:
    val = std::__cxx11::stod(__str.stringValue,(size_t *)0x0);
    pushFloat(this,val);
    goto LAB_00117708;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unknown varible type at variableEquals",&local_11);
    panic(this,&local_38);
  }
  pushFloat(this,__str.doubleValue);
LAB_00117708:
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::CastToFloat() {
  Variable top = this->popOpStack();

  switch (top.type) {
    case VariableType::Integer: {
      this->pushFloat(static_cast<double>(top.integerValue));
      break;
    }
    case VariableType::Float: {
      this->pushFloat(top.doubleValue);
      break;
    }
    case VariableType::Function: {
      this->pushUndefined();
      break;
    }
    case VariableType::Object: {
      this->pushUndefined();
      break;
    }
    case VariableType::String: {
      try {
        double val = std::stod(*top.stringValue);
        this->pushFloat(val);

      } catch (...) {
        this->pushUndefined();
      }
      break;
    }
    case VariableType::Undefined: {
      this->pushUndefined();
      break;
    }
    case VariableType::Boolean: {
      this->pushUndefined();
      break;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }

  this->advance();
}